

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LinkedModelFile::clear_linkedmodelsearchpath(LinkedModelFile *this)

{
  StringParameter *this_00;
  Arena *pAVar1;
  LinkedModelFile *this_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->linkedmodelsearchpath_ != (StringParameter *)0x0)) &&
     (this_00 = this->linkedmodelsearchpath_, this_00 != (StringParameter *)0x0)) {
    StringParameter::~StringParameter(this_00);
    operator_delete(this_00,0x20);
  }
  this->linkedmodelsearchpath_ = (StringParameter *)0x0;
  return;
}

Assistant:

void LinkedModelFile::clear_linkedmodelsearchpath() {
  if (GetArenaForAllocation() == nullptr && linkedmodelsearchpath_ != nullptr) {
    delete linkedmodelsearchpath_;
  }
  linkedmodelsearchpath_ = nullptr;
}